

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O0

void * Proof_DeriveCore(Vec_Set_t *vProof,int hRoot)

{
  Vec_Int_t *vUsed_00;
  Vec_Int_t *vUsed;
  Vec_Int_t *vCore;
  Vec_Int_t *vRoots;
  Vec_Int_t Roots;
  int hRoot_local;
  Vec_Set_t *vProof_local;
  
  vRoots._0_4_ = 1;
  vRoots._4_4_ = 1;
  Roots._0_8_ = (long)&Roots.pArray + 4;
  if (hRoot == -1) {
    vProof_local = (Vec_Set_t *)0x0;
  }
  else {
    Roots.pArray._4_4_ = hRoot;
    vUsed_00 = Proof_CollectUsedIter(vProof,(Vec_Int_t *)&vRoots,0);
    vProof_local = (Vec_Set_t *)Sat_ProofCollectCore(vProof,vUsed_00);
    Vec_IntFree(vUsed_00);
    Vec_IntSort((Vec_Int_t *)vProof_local,1);
  }
  return vProof_local;
}

Assistant:

void * Proof_DeriveCore( Vec_Set_t * vProof, int hRoot )
{
    Vec_Int_t Roots = { 1, 1, &hRoot }, * vRoots = &Roots;
    Vec_Int_t * vCore, * vUsed;
    if ( hRoot == -1 )
        return NULL;
    // collect visited clauses
    vUsed = Proof_CollectUsedIter( vProof, vRoots, 0 );
    // collect core clauses 
    vCore = Sat_ProofCollectCore( vProof, vUsed );
    Vec_IntFree( vUsed );
    Vec_IntSort( vCore, 1 );
    return vCore;
}